

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,int *param_2,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *param_3)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  cpp_dec_float<50U,_int,_void> *v;
  int *piVar5;
  int iVar6;
  long lVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  int *local_58;
  pointer local_50;
  int *local_48;
  int *local_40;
  long local_38;
  
  iVar4 = (this->l).firstUpdate;
  local_38 = (long)iVar4;
  iVar6 = (this->l).firstUnused;
  if (iVar4 < iVar6) {
    local_50 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->l).idx;
    local_40 = (this->l).row;
    local_48 = (this->l).start;
    lVar7 = (long)iVar6;
    do {
      lVar1 = lVar7 + -1;
      iVar4 = local_40[lVar7 + -1];
      local_98.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 8);
      local_98.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
      local_98.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
      puVar2 = vec[iVar4].m_backend.data._M_elems + 4;
      local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_98.exp = vec[iVar4].m_backend.exp;
      local_98.neg = vec[iVar4].m_backend.neg;
      local_98.fpclass = vec[iVar4].m_backend.fpclass;
      local_98.prec_elem = vec[iVar4].m_backend.prec_elem;
      if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_0028ef8c:
        iVar4 = local_48[lVar1];
        iVar6 = local_48[lVar7];
        if (iVar4 < iVar6) {
          piVar5 = local_58 + iVar4;
          pcVar8 = &local_50[iVar4].m_backend;
          do {
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems._24_5_ = 0;
            local_d8.data._M_elems[7]._1_3_ = 0;
            local_d8.data._M_elems._32_5_ = 0;
            local_d8.data._M_elems[9]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            v = &local_98;
            if (pcVar8 != &local_d8) {
              local_d8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
              local_d8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
              local_d8.data._M_elems[4] = local_98.data._M_elems[4];
              local_d8.data._M_elems[5] = local_98.data._M_elems[5];
              local_d8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
              local_d8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
              local_d8.data._M_elems[0] = local_98.data._M_elems[0];
              local_d8.data._M_elems[1] = local_98.data._M_elems[1];
              local_d8.data._M_elems[2] = local_98.data._M_elems[2];
              local_d8.data._M_elems[3] = local_98.data._M_elems[3];
              local_d8.exp = local_98.exp;
              local_d8.neg = local_98.neg;
              local_d8.fpclass = local_98.fpclass;
              local_d8.prec_elem = local_98.prec_elem;
              v = pcVar8;
            }
            pcVar8 = pcVar8 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_d8,v);
            iVar3 = *piVar5;
            piVar5 = piVar5 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[iVar3].m_backend,&local_d8);
            iVar6 = iVar6 + -1;
          } while (iVar4 < iVar6);
        }
      }
      else {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_98,&local_d8);
        if (iVar4 != 0) goto LAB_0028ef8c;
      }
      lVar7 = lVar1;
    } while (local_38 < lVar1);
  }
  return 0;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R* vec, int* /* nonz */, R /* eps */)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }

   return 0;
}